

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

int av1_get_cb_rdmult(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int mi_row,int mi_col)

{
  byte bVar1;
  byte bVar2;
  aom_enc_pass aVar3;
  int iVar4;
  AV1_PRIMARY *pAVar5;
  TplDepFrame *pTVar6;
  TplDepStats *pTVar7;
  long lVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint is_stat_consumption_stage;
  int col;
  int mi_col_00;
  int iVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  
  bVar1 = cpi->gf_frame_index;
  pAVar5 = cpi->ppi;
  iVar10 = (pAVar5->p_rc).gfu_boost;
  iVar11 = (pAVar5->gf_group).layer_depth[bVar1];
  aVar3 = (cpi->oxcf).pass;
  if (aVar3 < AOM_RC_LAST_PASS) {
    is_stat_consumption_stage = 0;
    if ((aVar3 == AOM_RC_ONE_PASS) && (cpi->compressor_stage == '\0')) {
      is_stat_consumption_stage = (uint)(pAVar5->lap_enabled != 0);
    }
  }
  else {
    is_stat_consumption_stage = 1;
  }
  iVar13 = 6;
  if (iVar11 < 6) {
    iVar13 = iVar11;
  }
  iVar11 = 0xf;
  if (iVar10 < 0x640) {
    iVar11 = iVar10 / 100;
  }
  iVar10 = av1_compute_rd_mult(x->rdmult_delta_qindex + (cpi->common).quant_params.base_qindex +
                               (cpi->common).quant_params.y_dc_delta_q,
                               ((cpi->common).seq_params)->bit_depth,
                               (pAVar5->gf_group).update_type[bVar1],iVar13,iVar11,
                               (cpi->common).current_frame.frame_type,
                               (cpi->oxcf).q_cfg.use_fixed_qp_offsets,is_stat_consumption_stage,
                               (cpi->oxcf).tune_cfg.tuning);
  iVar11 = av1_tpl_stats_ready(&cpi->ppi->tpl_data,(uint)bVar1);
  if (((iVar11 != 0) && ((cpi->common).superres_scale_denominator == '\b')) &&
     ((cpi->oxcf).q_cfg.aq_mode == '\0')) {
    dVar18 = 0.0;
    if ((x->rb != 0.0) || (NAN(x->rb))) {
      pAVar5 = cpi->ppi;
      pTVar6 = (pAVar5->tpl_data).tpl_frame;
      pTVar7 = pTVar6[bVar1].tpl_stats_ptr;
      bVar2 = "\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"[bsize];
      iVar11 = pTVar6[bVar1].stride;
      iVar14 = 1 << ((pAVar5->tpl_data).tpl_stats_block_mis_log2 & 0x1f);
      iVar13 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [bsize] + mi_row;
      dVar19 = 0.0;
      dVar20 = 0.0;
      for (; mi_col_00 = mi_col, mi_row < iVar13; mi_row = mi_row + iVar14) {
        for (; mi_col_00 < (int)((uint)bVar2 + mi_col); mi_col_00 = mi_col_00 + iVar14) {
          if ((mi_row < (cpi->common).mi_params.mi_rows) &&
             (mi_col_00 < (cpi->common).mi_params.mi_cols)) {
            iVar12 = av1_tpl_ptr_pos(mi_row,mi_col_00,iVar11,
                                     (pAVar5->tpl_data).tpl_stats_block_mis_log2);
            dVar15 = (double)pTVar7[iVar12].srcrf_dist;
            iVar4 = pTVar6[bVar1].base_rdmult;
            lVar8 = pTVar7[iVar12].mc_dep_rate;
            lVar9 = pTVar7[iVar12].mc_dep_dist;
            dVar16 = (double)(pTVar7[iVar12].recrf_dist << 7);
            dVar17 = log(dVar16);
            dVar16 = log(dVar16 * 3.0 + (double)(lVar9 * 0x80 + (iVar4 * lVar8 + 0x100 >> 9)));
            dVar18 = dVar18 + dVar15;
            dVar19 = dVar19 + dVar15 * dVar16;
            dVar20 = dVar20 + dVar15 * dVar17;
          }
        }
      }
      if ((dVar18 != 0.0) || (NAN(dVar18))) {
        dVar18 = exp((dVar20 - dVar19) / dVar18);
        iVar11 = (int)((dVar18 / x->rb) * (double)iVar10);
        iVar10 = 1;
        if (1 < iVar11) {
          iVar10 = iVar11;
        }
      }
    }
  }
  return iVar10;
}

Assistant:

int av1_get_cb_rdmult(const AV1_COMP *const cpi, MACROBLOCK *const x,
                      const BLOCK_SIZE bsize, const int mi_row,
                      const int mi_col) {
  const AV1_COMMON *const cm = &cpi->common;
  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));
  const int tpl_idx = cpi->gf_frame_index;
  int deltaq_rdmult = set_rdmult(cpi, x, -1);
  if (!av1_tpl_stats_ready(&cpi->ppi->tpl_data, tpl_idx)) return deltaq_rdmult;
  if (cm->superres_scale_denominator != SCALE_NUMERATOR) return deltaq_rdmult;
  if (cpi->oxcf.q_cfg.aq_mode != NO_AQ) return deltaq_rdmult;
  if (x->rb == 0) return deltaq_rdmult;

  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[tpl_idx];
  TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;

  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  int tpl_stride = tpl_frame->stride;
  double intra_cost_base = 0;
  double mc_dep_cost_base = 0;
  double cbcmp_base = 0;
  const int step = 1 << tpl_data->tpl_stats_block_mis_log2;

  for (int row = mi_row; row < mi_row + mi_high; row += step) {
    for (int col = mi_col; col < mi_col + mi_wide; col += step) {
      if (row >= cm->mi_params.mi_rows || col >= cm->mi_params.mi_cols)
        continue;

      TplDepStats *this_stats = &tpl_stats[av1_tpl_ptr_pos(
          row, col, tpl_stride, tpl_data->tpl_stats_block_mis_log2)];

      double cbcmp = (double)this_stats->srcrf_dist;
      int64_t mc_dep_delta =
          RDCOST(tpl_frame->base_rdmult, this_stats->mc_dep_rate,
                 this_stats->mc_dep_dist);
      double dist_scaled = (double)(this_stats->recrf_dist << RDDIV_BITS);
      intra_cost_base += log(dist_scaled) * cbcmp;
      mc_dep_cost_base += log(3 * dist_scaled + mc_dep_delta) * cbcmp;
      cbcmp_base += cbcmp;
    }
  }

  if (cbcmp_base == 0) return deltaq_rdmult;

  double rk = exp((intra_cost_base - mc_dep_cost_base) / cbcmp_base);
  deltaq_rdmult = (int)(deltaq_rdmult * (rk / x->rb));

  return AOMMAX(deltaq_rdmult, 1);
}